

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int x25519_on_exchange(ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
                      ptls_iovec_t peerkey)

{
  ptls_key_exchange_context_t *__ptr;
  int local_3c;
  int ret;
  st_x25519_key_exchange_t *ctx;
  ptls_iovec_t *secret_local;
  int release_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_iovec_t peerkey_local;
  
  __ptr = *_ctx;
  if (secret == (ptls_iovec_t *)0x0) {
    local_3c = 0;
  }
  else if (peerkey.len == 0x20) {
    local_3c = x25519_derive_secret
                         (secret,(uint8_t *)(__ptr + 1),(uint8_t *)(__ptr + 2),(uint8_t *)0x0,
                          peerkey.base);
  }
  else {
    local_3c = 0x33;
  }
  if (release != 0) {
    (*ptls_clear_memory)(__ptr + 1,0x20);
    free(__ptr);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return local_3c;
}

Assistant:

static int x25519_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x25519_key_exchange_t *ctx = (struct st_x25519_key_exchange_t *)*_ctx;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = x25519_derive_secret(secret, ctx->priv, ctx->pub, NULL, peerkey.base);

Exit:
    if (release) {
        ptls_clear_memory(ctx->priv, sizeof(ctx->priv));
        free(ctx);
        *_ctx = NULL;
    }
    return ret;
}